

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_iterator.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  List<Employee_*> *this;
  Employee *pEVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  ListIterator<Employee_*> local_30;
  
  this = (List<Employee_*> *)operator_new(0x18);
  List<Employee_*>::List(this,200);
  pEVar2 = (Employee *)operator_new(1);
  lVar1 = this->_size;
  lVar4 = this->_count;
  if (lVar4 <= lVar1) {
    this->_items[lVar4] = pEVar2;
    lVar4 = lVar4 + 1;
    this->_count = lVar4;
  }
  pEVar2 = (Employee *)operator_new(1);
  if (lVar4 <= lVar1) {
    this->_items[lVar4] = pEVar2;
    lVar4 = lVar4 + 1;
    this->_count = lVar4;
  }
  pEVar2 = (Employee *)operator_new(1);
  if (lVar4 <= lVar1) {
    this->_items[lVar4] = pEVar2;
    lVar4 = lVar4 + 1;
    this->_count = lVar4;
  }
  local_30.super_Iterator<Employee_*>._vptr_Iterator = (_func_int **)&PTR_First_00103d48;
  iVar3 = 9;
  local_30._current = 0;
  local_30._list = this;
  while( true ) {
    if (lVar4 <= local_30._current) {
      return 0;
    }
    ListIterator<Employee_*>::CurrentItem(&local_30);
    Employee::Print();
    bVar5 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar5) break;
    local_30._current = local_30._current + 1;
    lVar4 = (local_30._list)->_count;
  }
  return 0;
}

Assistant:

int main()
{
    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);


    ListIterator<Employee*> i(employees);
    int count = 0;
    
    for (i.First(); !i.IsDone(); i.Next()) {
        count++;
        i.CurrentItem()->Print();
    
        if (count >= 10) {
            break;
        }
    }

}